

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

boolean qt_fill_input_buffer(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  size_t sVar6;
  
  pjVar1 = cinfo->src;
  if (pjVar1[0x4a].init_source == (_func_void_j_decompress_ptr *)0x0) {
    pjVar1->next_input_byte = (JOCTET *)&pjVar1[1].bytes_in_buffer;
    sVar6 = QIODevice::read((char *)pjVar1[1].next_input_byte,(longlong)&pjVar1[1].bytes_in_buffer);
  }
  else {
    lVar3 = QBuffer::data();
    puVar5 = *(undefined8 **)(lVar3 + 8);
    if (puVar5 == (undefined8 *)0x0) {
      puVar5 = &QByteArray::_empty;
    }
    lVar3 = (**(code **)(*(long *)pjVar1[0x4a].init_source + 0x78))();
    pjVar1->next_input_byte = (JOCTET *)((long)puVar5 + lVar3);
    lVar3 = QBuffer::data();
    lVar3 = *(long *)(lVar3 + 0x10);
    lVar4 = (**(code **)(*(long *)pjVar1[0x4a].init_source + 0x78))();
    sVar6 = lVar3 - lVar4;
    plVar2 = (long *)pjVar1[1].next_input_byte;
    lVar3 = QBuffer::data();
    (**(code **)(*plVar2 + 0x88))(plVar2,*(undefined8 *)(lVar3 + 0x10));
  }
  if ((long)sVar6 < 1) {
    pjVar1->next_input_byte = (JOCTET *)&pjVar1[1].bytes_in_buffer;
    *(undefined2 *)&pjVar1[1].bytes_in_buffer = 0xd9ff;
    sVar6 = 2;
  }
  pjVar1->bytes_in_buffer = sVar6;
  return 1;
}

Assistant:

static boolean qt_fill_input_buffer(j_decompress_ptr cinfo)
{
    my_jpeg_source_mgr* src = (my_jpeg_source_mgr*)cinfo->src;
    qint64 num_read = 0;
    if (src->memDevice) {
        src->next_input_byte = (const JOCTET *)(src->memDevice->data().constData() + src->memDevice->pos());
        num_read = src->memDevice->data().size() - src->memDevice->pos();
        src->device->seek(src->memDevice->data().size());
    } else {
        src->next_input_byte = src->buffer;
        num_read = src->device->read((char*)src->buffer, max_buf);
    }
    if (num_read <= 0) {
        // Insert a fake EOI marker - as per jpeglib recommendation
        src->next_input_byte = src->buffer;
        src->buffer[0] = (JOCTET) 0xFF;
        src->buffer[1] = (JOCTET) JPEG_EOI;
        src->bytes_in_buffer = 2;
    } else {
        src->bytes_in_buffer = num_read;
    }
    return TRUE;
}